

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryBuffer.cpp
# Opt level: O2

unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>
llvm::MemoryBuffer::getMemBuffer
          (StringRef InputData,StringRef BufferName,bool RequiresNullTerminator)

{
  MemoryBuffer *this;
  size_t __n;
  undefined7 in_register_00000081;
  StringRef SVar1;
  SmallVectorImpl<char> local_178;
  undefined1 local_168 [256];
  Twine local_68;
  undefined1 local_50 [8];
  StringRef BufferName_local;
  
  local_50 = (undefined1  [8])BufferName.Length;
  BufferName_local.Data = (char *)CONCAT71(in_register_00000081,RequiresNullTerminator);
  Twine::Twine(&local_68,(StringRef *)local_50);
  local_178.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.BeginX = local_168;
  local_178.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Size = 0;
  local_178.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Capacity = 0x100;
  SVar1 = Twine::toStringRef(&local_68,&local_178);
  __n = SVar1.Length;
  BufferName_local.Length = (size_t)SVar1.Data;
  this = (MemoryBuffer *)operator_new(__n + 0x19);
  if (__n != 0) {
    memcpy(this + 1,(void *)BufferName_local.Length,__n);
  }
  *(undefined1 *)((long)&this[1]._vptr_MemoryBuffer + __n) = 0;
  SmallVectorImpl<char>::~SmallVectorImpl(&local_178);
  this->_vptr_MemoryBuffer = (_func_int **)&PTR__MemoryBuffer_01128e60;
  init(this,(EVP_PKEY_CTX *)InputData.Length);
  *(MemoryBuffer **)InputData.Data = this;
  return (__uniq_ptr_data<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>,_true,_true>)
         (tuple<llvm::MemoryBuffer_*,_std::default_delete<llvm::MemoryBuffer>_>)InputData.Data;
}

Assistant:

std::unique_ptr<MemoryBuffer>
MemoryBuffer::getMemBuffer(StringRef InputData, StringRef BufferName,
                           bool RequiresNullTerminator) {
  auto *Ret = new (NamedBufferAlloc(BufferName))
      MemoryBufferMem<MemoryBuffer>(InputData, RequiresNullTerminator);
  return std::unique_ptr<MemoryBuffer>(Ret);
}